

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcCollapse.c
# Opt level: O0

int Abc_NtkCollapseReduce(Vec_Str_t *vSop,Vec_Int_t *vSupp,Vec_Int_t *vClass,Vec_Wec_t *vSupps)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  Vec_Int_t *pVVar4;
  Vec_Int_t *p;
  Vec_Int_t *vPres;
  char *pSop;
  char *pCube;
  int nVars;
  int iVar;
  int iCo;
  int k;
  int i;
  int j;
  Vec_Wec_t *vSupps_local;
  Vec_Int_t *vClass_local;
  Vec_Int_t *vSupp_local;
  Vec_Str_t *vSop_local;
  
  k = 0;
  iVar1 = Vec_IntSize(vSupp);
  pcVar3 = Vec_StrArray(vSop);
  iVar2 = Vec_StrSize(vSop);
  if (iVar2 == 4) {
    for (iCo = 0; iVar1 = Vec_IntSize(vClass), iCo < iVar1; iCo = iCo + 1) {
      iVar1 = Vec_IntEntry(vClass,iCo);
      pVVar4 = Vec_WecEntry(vSupps,iVar1);
      Vec_IntClear(pVVar4);
    }
    vSop_local._4_4_ = 1;
  }
  else {
    pVVar4 = Vec_IntStart(iVar1);
    for (pSop = pcVar3; *pSop != '\0'; pSop = pSop + (iVar1 + 3)) {
      for (iVar = 0; iVar < iVar1; iVar = iVar + 1) {
        if (pSop[iVar] != '-') {
          Vec_IntWriteEntry(pVVar4,iVar,1);
        }
      }
    }
    iVar2 = Vec_IntCountZero(pVVar4);
    pSop = pcVar3;
    if (iVar2 == 0) {
      Vec_IntFree(pVVar4);
      vSop_local._4_4_ = 0;
    }
    else {
      for (; *pSop != '\0'; pSop = pSop + (iVar1 + 3)) {
        for (iVar = 0; iVar < iVar1 + 3; iVar = iVar + 1) {
          if ((iVar1 <= iVar) || (iVar2 = Vec_IntEntry(pVVar4,iVar), iVar2 != 0)) {
            Vec_StrWriteEntry(vSop,k,pSop[iVar]);
            k = k + 1;
          }
        }
      }
      Vec_StrWriteEntry(vSop,k,'\0');
      Vec_StrShrink(vSop,k + 1);
      for (iCo = 0; iVar1 = Vec_IntSize(vClass), iCo < iVar1; iCo = iCo + 1) {
        iVar1 = Vec_IntEntry(vClass,iCo);
        k = 0;
        p = Vec_WecEntry(vSupps,iVar1);
        for (iVar = 0; iVar1 = Vec_IntSize(p), iVar < iVar1; iVar = iVar + 1) {
          iVar1 = Vec_IntEntry(p,iVar);
          iVar2 = Vec_IntEntry(pVVar4,iVar);
          if (iVar2 != 0) {
            Vec_IntWriteEntry(p,k,iVar1);
            k = k + 1;
          }
        }
        Vec_IntShrink(p,k);
      }
      Vec_IntFree(pVVar4);
      vSop_local._4_4_ = 1;
    }
  }
  return vSop_local._4_4_;
}

Assistant:

int Abc_NtkCollapseReduce( Vec_Str_t * vSop, Vec_Int_t * vSupp, Vec_Int_t * vClass, Vec_Wec_t * vSupps )
{
    int j = 0, i, k, iCo, iVar, nVars = Vec_IntSize(vSupp);
    char * pCube, * pSop = Vec_StrArray(vSop);
    Vec_Int_t * vPres;
    if ( Vec_StrSize(vSop) == 4 ) // constant
    {
        Vec_IntForEachEntry( vClass, iCo, i )
            Vec_IntClear( Vec_WecEntry(vSupps, iCo) );
        return 1;
    }
    vPres = Vec_IntStart( nVars );
    Abc_NtkSopForEachCube( pSop, nVars, pCube )
        for ( k = 0; k < nVars; k++ )
            if ( pCube[k] != '-' )
                Vec_IntWriteEntry( vPres, k, 1 );
    if ( Vec_IntCountZero(vPres) == 0 )
    {
        Vec_IntFree( vPres );
        return 0;
    }
    // reduce cubes
    Abc_NtkSopForEachCube( pSop, nVars, pCube )
        for ( k = 0; k < nVars + 3; k++ )
            if ( k >= nVars || Vec_IntEntry(vPres, k) )
                Vec_StrWriteEntry( vSop, j++, pCube[k] );
    Vec_StrWriteEntry( vSop, j++, '\0' );
    Vec_StrShrink( vSop, j );
    // reduce support
    Vec_IntForEachEntry( vClass, iCo, i )
    {
        j = 0;
        vSupp = Vec_WecEntry( vSupps, iCo );
        Vec_IntForEachEntry( vSupp, iVar, k )
            if ( Vec_IntEntry(vPres, k) )
                Vec_IntWriteEntry( vSupp, j++, iVar );
        Vec_IntShrink( vSupp, j );
    }
    Vec_IntFree( vPres );
//    if ( Vec_IntSize(vSupp) != Abc_SopGetVarNum(Vec_StrArray(vSop)) )
//        printf( "Mismatch!!!\n" );
    return 1;
}